

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void env_container_put(Container c,int line,Environment *env)

{
  Record *pRVar1;
  Record **ppRVar2;
  char *__format;
  
  pRVar1 = env_match(c.name,env);
  if (pRVar1 != (Record *)0x0) {
    __format = 
    "\x1b[31m\n[Runtime Error] [Line:%d] Identifer %s cannot be redefined as a container in the same scope!\x1b[0m"
    ;
    if ((pRVar1->object).type == OBJECT_CONTAINER) {
      __format = "\x1b[31m\n[Runtime Error] [Line:%d] Container %s is already defined!\x1b[0m";
    }
    printf(__format,line,c.name);
    stop();
  }
  pRVar1 = (Record *)malloc(0x50);
  pRVar1->name = c.name;
  (pRVar1->object).type = OBJECT_CONTAINER;
  (pRVar1->object).field_1.instance = (Instance *)c._0_8_;
  (pRVar1->object).field_1.routine.name = c.name;
  *(undefined8 *)((long)&(pRVar1->object).field_1 + 0x10) = c._16_8_;
  (pRVar1->object).field_1.routine.arguments = c.arguments;
  *(undefined8 *)((long)&(pRVar1->object).field_1 + 0x20) = c.constructor._0_8_;
  *(Statement **)((long)&(pRVar1->object).field_1 + 0x28) = c.constructor.statements;
  pRVar1->next = (Record *)0x0;
  ppRVar2 = &env->rear;
  if (env->front != (Record *)0x0) {
    env = (Environment *)ppRVar2;
    ppRVar2 = &(*ppRVar2)->next;
  }
  *ppRVar2 = pRVar1;
  env->front = pRVar1;
  return;
}

Assistant:

void env_container_put(Container c, int line, Environment *env){
    Record *match = env_match(c.name, env);
    if(match != NULL){
        if(match->object.type != OBJECT_CONTAINER){
            printf(runtime_error("Identifer %s cannot be redefined as a container in the same scope!"), line, c.name);
        }
        else{
            printf(runtime_error("Container %s is already defined!"), line, c.name);
        }
        stop();
    }

    Object o;
    o.type = OBJECT_CONTAINER;
    o.container = c;

    rec_new(c.name, o, env);
}